

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
nonius::detail::estimate_clock_cost<std::chrono::_V2::system_clock>
          (environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,FloatDuration<std::chrono::_V2::system_clock> resolution)

{
  anon_class_16_2_7d74a361 __gen;
  __buckets_ptr pp_Var1;
  size_type sVar2;
  detail *pdVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last;
  anon_class_4_1_54a3980b *in_RSI;
  anon_class_1_0_00000001_for_time_clock *in_R9;
  anon_class_1_0_00000001_for_time_clock time_clock;
  vector<double,_std::allocator<double>_> times;
  undefined8 in_stack_ffffffffffffff68;
  TimingOf<std::chrono::_V2::system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&(run_for_at_least_argument_t<system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&>)>
  *pTVar4;
  double dVar5;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88;
  outlier_classification local_50;
  TimingOf<std::chrono::_V2::system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&(run_for_at_least_argument_t<system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&>)>
  local_38;
  
  local_88._M_buckets = (__buckets_ptr)CONCAT44(local_88._M_buckets._4_4_,1);
  operator()((detail *)&local_88,in_RSI);
  local_88._M_buckets = &local_88._M_single_bucket;
  local_88._M_bucket_count = 1;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_element_count = 0;
  local_88._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_rehash_policy._4_4_ = 0;
  local_88._M_rehash_policy._M_next_resize = 0;
  local_88._M_single_bucket = (__node_base_ptr)0x0;
  last._M_current = (double *)0x2710;
  run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::estimate_clock_cost<std::chrono::_V2::system_clock>(std::chrono::duration<double,std::chrono::_V2::system_clock::period>)::_lambda(int)_1_&>
            (&local_38,(detail *)&local_88,(parameters *)0x989680,
             (Duration<std::chrono::_V2::system_clock>)0x2710,(int)&stack0xffffffffffffff6f,in_R9);
  pTVar4 = (TimingOf<std::chrono::_V2::system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&(run_for_at_least_argument_t<system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&>)>
            *)(resolution.__r * 100000.0);
  if (1000000000.0 <= (double)pTVar4) {
    pTVar4 = (TimingOf<std::chrono::_V2::system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&(run_for_at_least_argument_t<system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&>)>
              *)0x41cdcd6500000000;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_88);
  local_88._M_buckets = (__buckets_ptr)0x0;
  local_88._M_bucket_count = 0;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dVar5 = ceil((double)pTVar4 / (double)local_38.elapsed.__r);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)&local_88,(long)(int)dVar5);
  __gen.r = pTVar4;
  __gen._0_8_ = in_stack_ffffffffffffff68;
  std::
  generate_n<std::back_insert_iterator<std::vector<double,std::allocator<double>>>,int,nonius::detail::estimate_clock_cost<std::chrono::_V2::system_clock>(std::chrono::duration<double,std::chrono::_V2::system_clock::period>)::_lambda()_1_>
            ((vector<double,_std::allocator<double>_> *)&local_88,(int)dVar5,__gen);
  sVar2 = local_88._M_bucket_count;
  pp_Var1 = local_88._M_buckets;
  dVar5 = 0.0;
  for (pdVar3 = (detail *)local_88._M_buckets; pdVar3 != (detail *)local_88._M_bucket_count;
      pdVar3 = pdVar3 + 8) {
    dVar5 = dVar5 + *(double *)pdVar3;
  }
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (&local_50,(detail *)local_88._M_buckets,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_88._M_bucket_count,last);
  (__return_storage_ptr__->outliers).high_severe = local_50.high_severe;
  (__return_storage_ptr__->outliers).samples_seen = local_50.samples_seen;
  (__return_storage_ptr__->outliers).low_severe = local_50.low_severe;
  (__return_storage_ptr__->outliers).low_mild = local_50.low_mild;
  (__return_storage_ptr__->outliers).high_mild = local_50.high_mild;
  (__return_storage_ptr__->mean).__r = dVar5 / (double)((long)(sVar2 - (long)pp_Var1) >> 3);
  if ((detail *)local_88._M_buckets != (detail *)0x0) {
    operator_delete(local_88._M_buckets,
                    (long)local_88._M_before_begin._M_nxt - (long)local_88._M_buckets);
  }
  return __return_storage_ptr__;
}

Assistant:

environment_estimate<FloatDuration<Clock>> estimate_clock_cost(FloatDuration<Clock> resolution) {
            auto time_limit = std::min(resolution * clock_cost_estimation_tick_limit, FloatDuration<Clock>(clock_cost_estimation_time_limit));
            auto time_clock = [](int k) {
                return detail::measure<Clock>([k]{
                    for(int i = 0; i < k; ++i) {
                        volatile auto ignored = Clock::now();
                        (void)ignored;
                    }
                }).elapsed;
            };
            time_clock(1);
            int iters = clock_cost_estimation_iterations;
            auto&& r = run_for_at_least<Clock>({}, chrono::duration_cast<Duration<Clock>>(clock_cost_estimation_time), iters, time_clock);
            std::vector<double> times;
            int nsamples = static_cast<int>(std::ceil(time_limit / r.elapsed));
            times.reserve(nsamples);
            std::generate_n(std::back_inserter(times), nsamples, [time_clock, &r]{
                        return (time_clock(r.iterations) / r.iterations).count();
                    });
            return {
                FloatDuration<Clock>(mean(times.begin(), times.end())),
                classify_outliers(times.begin(), times.end()),
            };
        }